

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O3

bool test_Player_Constructor(void)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  vector<Map::Country*,std::allocator<Map::Country*>> *this;
  Hand *this_00;
  DiceRoller *this_01;
  Player *this_02;
  bool bVar2;
  iterator iVar3;
  Country *pCountry2;
  Country *pCountry3;
  Country *pCountry1;
  Deck deck;
  Country country3;
  Country country2;
  Country country1;
  Country *local_148;
  Country *local_140;
  Country *local_138;
  string local_130;
  string local_110;
  Deck local_f0;
  string local_d8;
  Country local_b8;
  Country local_88;
  Country local_58;
  
  this = (vector<Map::Country*,std::allocator<Map::Country*>> *)operator_new(0x18);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"country1","");
  Map::Country::Country(&local_58,0,&local_d8,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"country2","");
  Map::Country::Country(&local_88,1,&local_110,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"country3","");
  Map::Country::Country(&local_b8,3,&local_130,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  iVar3._M_current = *(Country ***)(this + 8);
  local_148 = &local_88;
  local_140 = &local_b8;
  local_138 = &local_58;
  if (iVar3._M_current == *(Country ***)(this + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (this,iVar3,&local_138);
    iVar3._M_current = *(Country ***)(this + 8);
  }
  else {
    *iVar3._M_current = &local_58;
    iVar3._M_current = (Country **)(*(long *)(this + 8) + 8);
    *(Country ***)(this + 8) = iVar3._M_current;
  }
  if (iVar3._M_current == *(Country ***)(this + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (this,iVar3,&local_148);
    iVar3._M_current = *(Country ***)(this + 8);
  }
  else {
    *iVar3._M_current = local_148;
    iVar3._M_current = (Country **)(*(long *)(this + 8) + 8);
    *(Country ***)(this + 8) = iVar3._M_current;
  }
  if (iVar3._M_current == *(Country ***)(this + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (this,iVar3,&local_140);
  }
  else {
    *iVar3._M_current = &local_b8;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  this_00 = (Hand *)operator_new(8);
  Hand::Hand(this_00);
  Deck::Deck(&local_f0,3);
  Deck::createDeck(&local_f0);
  Deck::draw(&local_f0,this_00);
  this_01 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_01);
  this_02 = (Player *)operator_new(0x38);
  Player::Player(this_02,(vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)this,this_00,
                 this_01,1);
  if ((((this_02->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (this_02->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) ||
      (pvVar1 = this_02->pCards->handPointer,
      (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish)) || (bVar2 = true, *this_02->pPlayerId != 1)) {
    bVar2 = false;
  }
  Player::~Player(this_02);
  operator_delete(this_02,0x38);
  Deck::~Deck(&local_f0);
  Map::Country::~Country(&local_b8);
  Map::Country::~Country(&local_88);
  Map::Country::~Country(&local_58);
  return bVar2;
}

Assistant:

bool test_Player_Constructor() {

    // Arrange
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    Map::Country country1 = Map::Country(0, "country1", 0);
    Map::Country country2 = Map::Country(1, "country2", 0);
    Map::Country country3 = Map::Country(3, "country3", 1);
    Map::Country* pCountry1 = &country1;
    Map::Country* pCountry2 = &country2;
    Map::Country* pCountry3 = &country3;
    ownedCountries1->push_back(pCountry1);
    ownedCountries1->push_back(pCountry2);
    ownedCountries1->push_back(pCountry3);
    auto* cards = new Hand();
    Deck deck = Deck(3);
    deck.createDeck();
    deck.draw(*cards);
    auto* diceRoller = new DiceRoller();
    const int playerId = 1;
    bool success = true;

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, playerId);

    // Assert
    if (player1->getOwnedCountries()->empty() || player1->getCards()->getHand()->empty() ||
        playerId != player1->getPlayerId()) {
        success = false;
    }

    delete player1;
    return success;
}